

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

PtrTokenOrSyntax * __thiscall
slang::syntax::ParameterPortListSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,ParameterPortListSyntax *this,size_t index)

{
  __index_type *p_Var1;
  
  switch(this) {
  case (ParameterPortListSyntax *)0x0:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[1].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (ParameterPortListSyntax *)0x1:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[2].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (ParameterPortListSyntax *)0x2:
    return __return_storage_ptr__ + 4;
  case (ParameterPortListSyntax *)0x3:
    p_Var1 = (__index_type *)(__return_storage_ptr__ + 7);
    break;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return (PtrTokenOrSyntax *)p_Var1;
}

Assistant:

PtrTokenOrSyntax ParameterPortListSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &hash;
        case 1: return &openParen;
        case 2: return &declarations;
        case 3: return &closeParen;
        default: return nullptr;
    }
}